

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O3

uint64_t lj_math_random_step(RandomState *rs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = rs->gen[0];
  uVar2 = rs->gen[1];
  uVar1 = (uVar4 & 0xfffffffffffffffe) << 0x12 | (uVar4 << 0x1f ^ uVar4) >> 0x2d;
  rs->gen[0] = uVar1;
  uVar2 = (uVar2 & 0xffffffffffffffc0) << 0x1c | (uVar2 << 0x13 ^ uVar2) >> 0x1e;
  rs->gen[1] = uVar2;
  uVar4 = rs->gen[2];
  uVar3 = (uVar4 & 0x1fffffffffffe00) << 7 | (uVar4 << 0x18 ^ uVar4) >> 0x30;
  rs->gen[2] = uVar3;
  uVar4 = rs->gen[3];
  uVar4 = (uVar4 & 0xfffffffffe0000) << 8 | (uVar4 << 0x15 ^ uVar4) >> 0x27;
  rs->gen[3] = uVar4;
  return (uVar3 ^ uVar4 ^ uVar1 ^ uVar2) & 0xfffffffffffff | 0x3ff0000000000000;
}

Assistant:

LJ_FASTCALL lj_math_random_step(RandomState *rs)
{
  uint64_t z, r = 0;
  TW223_GEN(0, 63, 31, 18)
  TW223_GEN(1, 58, 19, 28)
  TW223_GEN(2, 55, 24,  7)
  TW223_GEN(3, 47, 21,  8)
  return (r & U64x(000fffff,ffffffff)) | U64x(3ff00000,00000000);
}